

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteUnittest.cpp
# Opt level: O0

void __thiscall ReadWriteUnittest::FillFields(ReadWriteUnittest *this)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  int local_28;
  int local_24;
  int j_1;
  int k_1;
  int i_1;
  int k;
  int j;
  int i;
  ReadWriteUnittest *this_local;
  
  for (k = 0; k < this->iSize; k = k + 1) {
    for (i_1 = 0; i_1 < this->jSize; i_1 = i_1 + 1) {
      for (k_1 = 0; k_1 < this->kSize; k_1 = k_1 + 1) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->fieldInt3,
                            (long)(k + i_1 * this->iSize + k_1 * this->iSize * this->jSize));
        *pvVar1 = (k + i_1 * 2) - k_1 * 0xc * k;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->fieldDouble3,
                            (long)(k + i_1 * this->iSize + k_1 * this->iSize * this->jSize));
        *pvVar2 = -((double)k_1 * 12.5) * (double)k + (double)k * 1.125 + (double)i_1 * 2.25;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&this->fieldFloat3,
                            (long)(k + i_1 * this->iSize + k_1 * this->iSize * this->jSize));
        *pvVar3 = -((float)k_1 * 16.0) * (float)k + (float)k * 1.5 + (float)i_1 * 4.25;
      }
    }
  }
  for (j_1 = 0; j_1 < this->iSize; j_1 = j_1 + 1) {
    for (local_24 = 0; local_24 < this->kSize; local_24 = local_24 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->fieldInt2,(long)(j_1 + local_24 * this->iSize));
      *pvVar1 = j_1 - local_24 * 0xc * j_1;
    }
  }
  for (local_28 = 0; local_28 < this->jSize; local_28 = local_28 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->fieldDouble1,(long)local_28);
    *pvVar2 = (double)(local_28 * local_28) + 2.875;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->fieldFloat1,(long)local_28);
    *pvVar3 = (float)(local_28 * local_28) + 3.5;
  }
  return;
}

Assistant:

void FillFields() {
        for (int i = 0; i < iSize; ++i)
            for (int j = 0; j < jSize; ++j)
                for (int k = 0; k < kSize; ++k)
                {
                    fieldInt3[i + j*iSize + k*iSize*jSize] = i + 2*j - 12*k*i;
                    fieldDouble3[i + j*iSize + k*iSize*jSize] = 1.125*i + 2.25*j - 12.5*k*i;
                    fieldFloat3[i + j*iSize + k*iSize*jSize] = 1.5f*i + 4.25f*j - 16.0f*k*i;
                }

        for (int i = 0; i < iSize; ++i)
            for (int k = 0; k < kSize; ++k)
            {
                fieldInt2[i + k*iSize] = i - 12*k*i;
            }

        for (int j = 0; j < jSize; ++j)
        {
            fieldDouble1[j] = j*j+2.875;
            fieldFloat1[j] = j*j+3.5f;
        }
    }